

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.hh
# Opt level: O1

VarnodeData * __thiscall AddrSpace::getSpacebaseFull(AddrSpace *this,int4 i)

{
  pointer pcVar1;
  LowlevelError *this_00;
  undefined4 in_register_00000034;
  string local_40;
  
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20,CONCAT44(in_register_00000034,i));
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  pcVar1 = (this->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->name)._M_string_length);
  std::__cxx11::string::append((char *)&local_40);
  LowlevelError::LowlevelError(this_00,&local_40);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

inline const VarnodeData &AddrSpace::getSpacebaseFull(int4 i) const {
  throw LowlevelError(name+" has no truncated registers");
}